

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O0

bool mocker::detail::runOptPassImpl<mocker::LocalValueNumbering>
               (Module *module,BasicBlockPass *param_2)

{
  bool bVar1;
  FuncsMap *this;
  reference ppVar2;
  BasicBlockList *this_00;
  bool bVar3;
  LocalValueNumbering local_c0;
  reference local_60;
  BasicBlock *bb;
  iterator __end3;
  iterator __begin3;
  BasicBlockList *__range3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>
  *func;
  iterator __end2;
  iterator __begin2;
  FuncsMap *__range2;
  bool res;
  BasicBlockPass *param_1_local;
  Module *module_local;
  
  bVar3 = false;
  this = ir::Module::getFuncs_abi_cxx11_(module);
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
           ::begin(this);
  func = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>
          *)std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
            ::end(this);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
                              *)&func), bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_false,_true>
             ::operator*(&__end2);
    bVar1 = ir::FunctionModule::isExternalFunc(&ppVar2->second);
    if (!bVar1) {
      this_00 = ir::FunctionModule::getMutableBBs_abi_cxx11_(&ppVar2->second);
      __end3 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
               begin(this_00);
      bb = (BasicBlock *)
           std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                     (this_00);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&bb), bVar1) {
        local_60 = std::_List_iterator<mocker::ir::BasicBlock>::operator*(&__end3);
        LocalValueNumbering::LocalValueNumbering(&local_c0,local_60);
        bVar1 = LocalValueNumbering::operator()(&local_c0);
        bVar3 = bVar3 != false || bVar1;
        LocalValueNumbering::~LocalValueNumbering(&local_c0);
        std::_List_iterator<mocker::ir::BasicBlock>::operator++(&__end3);
      }
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_false,_true>
    ::operator++(&__end2);
  }
  return bVar3;
}

Assistant:

bool runOptPassImpl(ir::Module &module, BasicBlockPass *, Args &&... args) {
  auto res = false;
  for (auto &func : module.getFuncs()) {
    if (func.second.isExternalFunc())
      continue;
    for (auto &bb : func.second.getMutableBBs()) {
      res |= Pass{bb, std::forward<Args>(args)...}();
    }
  }
  return res;
}